

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

type * __thiscall rest_rpc::rpc_client::call<5000ul,person>(rpc_client *this,string *rpc_name)

{
  out_of_range *this_00;
  req_result *in_RDX;
  type *in_RDI;
  string *in_stack_00000030;
  rpc_client *in_stack_00000038;
  future_status status;
  future_result<rest_rpc::req_result> future_result;
  future_result<rest_rpc::req_result> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  unsigned_long local_48;
  duration<long,std::ratio<1l,1000l>> local_40 [12];
  future_status local_34;
  
  async_call<(rest_rpc::CallModel)0>(in_stack_00000038,in_stack_00000030);
  local_48 = 5000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>(local_40,&local_48)
  ;
  local_34 = future_result<rest_rpc::req_result>::wait_for<long,std::ratio<1l,1000l>>
                       ((future_result<rest_rpc::req_result> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff68);
  if ((local_34 != timeout) && (local_34 != deferred)) {
    future_result<rest_rpc::req_result>::get(in_stack_ffffffffffffff68);
    req_result::as<person>(in_RDX);
    req_result::~req_result((req_result *)0x1f73fe);
    future_result<rest_rpc::req_result>::~future_result
              ((future_result<rest_rpc::req_result> *)0x1f7408);
    return in_RDI;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"timeout or deferred");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

typename std::enable_if<!std::is_void<T>::value, T>::type
  call(const std::string &rpc_name, Args &&...args) {
    auto future_result =
        async_call<FUTURE>(rpc_name, std::forward<Args>(args)...);
    auto status = future_result.wait_for(std::chrono::milliseconds(TIMEOUT));
    if (status == std::future_status::timeout ||
        status == std::future_status::deferred) {
      throw std::out_of_range("timeout or deferred");
    }

    return future_result.get().template as<T>();
  }